

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

void __thiscall LexerTest_LexFloat_Test::TestBody(LexerTest_LexFloat_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Token *pTVar3;
  char *in_R9;
  string local_1e28;
  AssertHelper local_1e08;
  Message local_1e00;
  bool local_1df1;
  undefined1 local_1df0 [8];
  AssertionResult gtest_ar__31;
  undefined1 local_1dd0 [8];
  Lexer lexer_31;
  AssertHelper local_1d50;
  Message local_1d48;
  bool local_1d39;
  undefined1 local_1d38 [8];
  AssertionResult gtest_ar__30;
  undefined1 local_1d18 [8];
  Lexer lexer_30;
  AssertHelper local_1c98;
  Message local_1c90;
  bool local_1c81;
  undefined1 local_1c80 [8];
  AssertionResult gtest_ar__29;
  undefined1 local_1c60 [8];
  Lexer lexer_29;
  AssertHelper local_1be0;
  Message local_1bd8;
  bool local_1bc9;
  undefined1 local_1bc8 [8];
  AssertionResult gtest_ar__28;
  undefined1 local_1ba8 [8];
  Lexer lexer_28;
  AssertHelper local_1b28;
  Message local_1b20;
  bool local_1b11;
  undefined1 local_1b10 [8];
  AssertionResult gtest_ar__27;
  undefined1 local_1af0 [8];
  Lexer lexer_27;
  AssertHelper local_1a70;
  Message local_1a68;
  bool local_1a59;
  undefined1 local_1a58 [8];
  AssertionResult gtest_ar__26;
  undefined1 local_1a38 [8];
  Lexer lexer_26;
  AssertHelper local_19b8;
  Message local_19b0;
  bool local_19a1;
  undefined1 local_19a0 [8];
  AssertionResult gtest_ar__25;
  undefined1 local_1980 [8];
  Lexer lexer_25;
  AssertHelper local_1900;
  Message local_18f8;
  bool local_18e9;
  undefined1 local_18e8 [8];
  AssertionResult gtest_ar__24;
  undefined1 local_18c8 [8];
  Lexer lexer_24;
  AssertHelper local_1848;
  Message local_1840;
  bool local_1831;
  undefined1 local_1830 [8];
  AssertionResult gtest_ar__23;
  undefined1 local_1810 [8];
  Lexer lexer_23;
  AssertHelper local_1790;
  Message local_1788;
  bool local_1779;
  undefined1 local_1778 [8];
  AssertionResult gtest_ar__22;
  undefined1 local_1758 [8];
  Lexer lexer_22;
  AssertHelper local_16d8;
  Message local_16d0;
  bool local_16c1;
  undefined1 local_16c0 [8];
  AssertionResult gtest_ar__21;
  undefined1 local_16a0 [8];
  Lexer lexer_21;
  AssertHelper local_1620;
  Message local_1618;
  bool local_1609;
  undefined1 local_1608 [8];
  AssertionResult gtest_ar__20;
  undefined1 local_15e8 [8];
  Lexer lexer_20;
  AssertHelper local_1568;
  Message local_1560;
  bool local_1551;
  undefined1 local_1550 [8];
  AssertionResult gtest_ar__19;
  undefined1 local_1530 [8];
  Lexer lexer_19;
  AssertHelper local_14b0;
  Message local_14a8;
  bool local_1499;
  undefined1 local_1498 [8];
  AssertionResult gtest_ar__18;
  undefined1 local_1478 [8];
  Lexer lexer_18;
  AssertHelper local_13f8;
  Message local_13f0;
  bool local_13e1;
  undefined1 local_13e0 [8];
  AssertionResult gtest_ar__17;
  undefined1 local_13c0 [8];
  Lexer lexer_17;
  AssertHelper local_1340;
  Message local_1338;
  bool local_1329;
  undefined1 local_1328 [8];
  AssertionResult gtest_ar__16;
  undefined1 local_1308 [8];
  Lexer lexer_16;
  AssertHelper local_1288;
  Message local_1280;
  bool local_1271;
  undefined1 local_1270 [8];
  AssertionResult gtest_ar__15;
  undefined1 local_1250 [8];
  Lexer lexer_15;
  Message local_11e8;
  undefined1 local_11e0 [8];
  AssertionResult gtest_ar_14;
  undefined1 local_11b8 [8];
  Token expected_14;
  AssertHelper local_1158;
  Message local_1150;
  bool local_1141;
  undefined1 local_1140 [8];
  AssertionResult gtest_ar__14;
  undefined1 local_1120 [8];
  Lexer lexer_14;
  Message local_10b8;
  undefined1 local_10b0 [8];
  AssertionResult gtest_ar_13;
  undefined1 local_1088 [8];
  Token expected_13;
  AssertHelper local_1028;
  Message local_1020;
  bool local_1011;
  undefined1 local_1010 [8];
  AssertionResult gtest_ar__13;
  undefined1 local_ff0 [8];
  Lexer lexer_13;
  Message local_f88;
  undefined1 local_f80 [8];
  AssertionResult gtest_ar_12;
  undefined1 local_f58 [8];
  Token expected_12;
  AssertHelper local_ef8;
  Message local_ef0;
  bool local_ee1;
  undefined1 local_ee0 [8];
  AssertionResult gtest_ar__12;
  undefined1 local_ec0 [8];
  Lexer lexer_12;
  Message local_e58;
  undefined1 local_e50 [8];
  AssertionResult gtest_ar_11;
  undefined1 local_e28 [8];
  Token expected_11;
  AssertHelper local_dc8;
  Message local_dc0;
  bool local_db1;
  undefined1 local_db0 [8];
  AssertionResult gtest_ar__11;
  undefined1 local_d90 [8];
  Lexer lexer_11;
  Message local_d28;
  undefined1 local_d20 [8];
  AssertionResult gtest_ar_10;
  undefined1 local_cf8 [8];
  Token expected_10;
  AssertHelper local_c98;
  Message local_c90;
  bool local_c81;
  undefined1 local_c80 [8];
  AssertionResult gtest_ar__10;
  undefined1 local_c60 [8];
  Lexer lexer_10;
  Message local_bf8;
  undefined1 local_bf0 [8];
  AssertionResult gtest_ar_9;
  undefined1 local_bc8 [8];
  Token expected_9;
  AssertHelper local_b68;
  Message local_b60;
  bool local_b51;
  undefined1 local_b50 [8];
  AssertionResult gtest_ar__9;
  undefined1 local_b30 [8];
  Lexer lexer_9;
  Message local_ac8;
  undefined1 local_ac0 [8];
  AssertionResult gtest_ar_8;
  undefined1 local_a98 [8];
  Token expected_8;
  AssertHelper local_a38;
  Message local_a30;
  bool local_a21;
  undefined1 local_a20 [8];
  AssertionResult gtest_ar__8;
  undefined1 local_a00 [8];
  Lexer lexer_8;
  Message local_998;
  undefined1 local_990 [8];
  AssertionResult gtest_ar_7;
  undefined1 local_968 [8];
  Token expected_7;
  AssertHelper local_908;
  Message local_900;
  bool local_8f1;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar__7;
  undefined1 local_8d0 [8];
  Lexer lexer_7;
  Message local_868;
  undefined1 local_860 [8];
  AssertionResult gtest_ar_6;
  undefined1 local_838 [8];
  Token expected_6;
  AssertHelper local_7d8;
  Message local_7d0;
  bool local_7c1;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar__6;
  undefined1 local_7a0 [8];
  Lexer lexer_6;
  Message local_738;
  undefined1 local_730 [8];
  AssertionResult gtest_ar_5;
  undefined1 local_708 [8];
  Token expected_5;
  AssertHelper local_6a8;
  Message local_6a0;
  bool local_691;
  undefined1 local_690 [8];
  AssertionResult gtest_ar__5;
  undefined1 local_670 [8];
  Lexer lexer_5;
  Message local_608;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_5d8 [8];
  Token expected_4;
  AssertHelper local_578;
  Message local_570;
  bool local_561;
  undefined1 local_560 [8];
  AssertionResult gtest_ar__4;
  undefined1 local_540 [8];
  Lexer lexer_4;
  Message local_4d8;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_4a8 [8];
  Token expected_3;
  AssertHelper local_448;
  Message local_440;
  bool local_431;
  undefined1 local_430 [8];
  AssertionResult gtest_ar__3;
  undefined1 local_410 [8];
  Lexer lexer_3;
  Message local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_378 [8];
  Token expected_2;
  AssertHelper local_318;
  Message local_310;
  bool local_301;
  undefined1 local_300 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_2e0 [8];
  Lexer lexer_2;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_248 [8];
  Token expected_1;
  AssertHelper local_1e8;
  Message local_1e0;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_1b0 [8];
  Lexer lexer_1;
  Message local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  undefined1 local_120 [8];
  Token expected;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0 [3];
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  undefined1 local_70 [8];
  Lexer lexer;
  LexerTest_LexFloat_Test *this_local;
  
  lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
  super__Optional_payload_base<wasm::WATParser::Token>._64_8_ = this;
  join_0x00000010_0x00000000_ = sv("42",2);
  wasm::WATParser::Lexer::Lexer((Lexer *)local_70,join_0x00000010_0x00000000_);
  bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_70);
  local_91 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_90,(AssertionResult *)"lexer.empty()","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2e0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(local_b0);
  }
  expected.data.
  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  ._45_3_ = 0;
  expected.data.
  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  ._44_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (expected.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._44_4_ == 0) {
    _local_120 = sv("42",2);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x2a;
    std::
    variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
    ::variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
              ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                *)&expected.span._M_str,(IntTok *)&gtest_ar.message_);
    pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_70);
    testing::internal::EqHelper::Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
              ((EqHelper *)local_140,"*lexer","expected",pTVar3,(Token *)local_120);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &lexer_1.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                  .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x2e2,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &lexer_1.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                  .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,&local_148);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &lexer_1.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                  .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
      testing::Message::~Message(&local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
    wasm::WATParser::Token::~Token((Token *)local_120);
    expected.data.
    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ._44_4_ = 0;
  }
  wasm::WATParser::Lexer::~Lexer((Lexer *)local_70);
  if (expected.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._44_4_ == 0) {
    join_0x00000010_0x00000000_ = sv("42.",3);
    wasm::WATParser::Lexer::Lexer((Lexer *)local_1b0,join_0x00000010_0x00000000_);
    bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_1b0);
    local_1d1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
    if (!bVar1) {
      testing::Message::Message(&local_1e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 ((long)&expected_1.data.
                         super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                 + 0x28),(internal *)local_1d0,(AssertionResult *)"lexer.empty()","true","false",
                 in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x2e6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      std::__cxx11::string::~string
                ((string *)
                 ((long)&expected_1.data.
                         super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                 + 0x28));
      testing::Message::~Message(&local_1e0);
    }
    expected.data.
    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ._45_3_ = 0;
    expected.data.
    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ._44_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
    if (expected.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._44_4_ == 0) {
      _local_248 = sv("42.",3);
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&gtest_ar_1.message_);
      std::
      variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
      ::variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                  *)&expected_1.span._M_str,(FloatTok *)&gtest_ar_1.message_);
      pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_1b0);
      testing::internal::EqHelper::Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                ((EqHelper *)local_270,"*lexer","expected",pTVar3,(Token *)local_248);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
      if (!bVar1) {
        testing::Message::Message(&local_278);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &lexer_2.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                    _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,kNonFatalFailure
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x2e8,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &lexer_2.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                    _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,&local_278);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &lexer_2.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                    _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
        testing::Message::~Message(&local_278);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
      wasm::WATParser::Token::~Token((Token *)local_248);
      expected.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._44_4_ = 0;
    }
    wasm::WATParser::Lexer::~Lexer((Lexer *)local_1b0);
    if (expected.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._44_4_ == 0) {
      join_0x00000010_0x00000000_ = sv("42.5",4);
      wasm::WATParser::Lexer::Lexer((Lexer *)local_2e0,join_0x00000010_0x00000000_);
      bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_2e0);
      local_301 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_300,&local_301,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
      if (!bVar1) {
        testing::Message::Message(&local_310);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   ((long)&expected_2.data.
                           super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                   + 0x28),(internal *)local_300,(AssertionResult *)"lexer.empty()","true","false",
                   in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_318,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x2ec,pcVar2);
        testing::internal::AssertHelper::operator=(&local_318,&local_310);
        testing::internal::AssertHelper::~AssertHelper(&local_318);
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&expected_2.data.
                           super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                   + 0x28));
        testing::Message::~Message(&local_310);
      }
      expected.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._45_3_ = 0;
      expected.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._44_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
      if (expected.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._44_4_ == 0) {
        _local_378 = sv("42.5",4);
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)&gtest_ar_2.message_);
        std::
        variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
        ::variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                  ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                    *)&expected_2.span._M_str,(FloatTok *)&gtest_ar_2.message_);
        pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_2e0);
        testing::internal::EqHelper::
        Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                  ((EqHelper *)local_3a0,"*lexer","expected",pTVar3,(Token *)local_378);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
        if (!bVar1) {
          testing::Message::Message(&local_3a8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &lexer_3.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                     kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x2ee,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &lexer_3.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,&local_3a8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     &lexer_3.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
          testing::Message::~Message(&local_3a8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
        wasm::WATParser::Token::~Token((Token *)local_378);
        expected.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._44_4_ = 0;
      }
      wasm::WATParser::Lexer::~Lexer((Lexer *)local_2e0);
      if (expected.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._44_4_ == 0) {
        join_0x00000010_0x00000000_ = sv("42e0",4);
        wasm::WATParser::Lexer::Lexer((Lexer *)local_410,join_0x00000010_0x00000000_);
        bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_410);
        local_431 = (bool)(~bVar1 & 1);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_430,&local_431,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
        if (!bVar1) {
          testing::Message::Message(&local_440);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)
                     ((long)&expected_3.data.
                             super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                     + 0x28),(internal *)local_430,(AssertionResult *)"lexer.empty()","true","false"
                     ,in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_448,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x2f2,pcVar2);
          testing::internal::AssertHelper::operator=(&local_448,&local_440);
          testing::internal::AssertHelper::~AssertHelper(&local_448);
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&expected_3.data.
                             super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                     + 0x28));
          testing::Message::~Message(&local_440);
        }
        expected.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._45_3_ = 0;
        expected.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._44_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
        if (expected.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._44_4_ == 0) {
          _local_4a8 = sv("42e0",4);
          std::optional<unsigned_long>::optional((optional<unsigned_long> *)&gtest_ar_3.message_);
          std::
          variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
          ::variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                    ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                      *)&expected_3.span._M_str,(FloatTok *)&gtest_ar_3.message_);
          pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_410);
          testing::internal::EqHelper::
          Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                    ((EqHelper *)local_4d0,"*lexer","expected",pTVar3,(Token *)local_4a8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
          if (!bVar1) {
            testing::Message::Message(&local_4d8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)
                       &lexer_4.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                       kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x2f4,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)
                       &lexer_4.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,&local_4d8);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)
                       &lexer_4.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
            testing::Message::~Message(&local_4d8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
          wasm::WATParser::Token::~Token((Token *)local_4a8);
          expected.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._44_4_ = 0;
        }
        wasm::WATParser::Lexer::~Lexer((Lexer *)local_410);
        if (expected.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._44_4_ == 0) {
          join_0x00000010_0x00000000_ = sv("42.e1",5);
          wasm::WATParser::Lexer::Lexer((Lexer *)local_540,join_0x00000010_0x00000000_);
          bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_540);
          local_561 = (bool)(~bVar1 & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_560,&local_561,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
          if (!bVar1) {
            testing::Message::Message(&local_570);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)
                       ((long)&expected_4.data.
                               super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       + 0x28),(internal *)local_560,(AssertionResult *)"lexer.empty()","true",
                       "false",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_578,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x2f8,pcVar2);
            testing::internal::AssertHelper::operator=(&local_578,&local_570);
            testing::internal::AssertHelper::~AssertHelper(&local_578);
            std::__cxx11::string::~string
                      ((string *)
                       ((long)&expected_4.data.
                               super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       + 0x28));
            testing::Message::~Message(&local_570);
          }
          expected.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._45_3_ = 0;
          expected.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._44_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
          if (expected.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._44_4_ == 0) {
            _local_5d8 = sv("42.e1",5);
            std::optional<unsigned_long>::optional((optional<unsigned_long> *)&gtest_ar_4.message_);
            std::
            variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
            ::variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                      ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                        *)&expected_4.span._M_str,(FloatTok *)&gtest_ar_4.message_);
            pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_540);
            testing::internal::EqHelper::
            Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                      ((EqHelper *)local_600,"*lexer","expected",pTVar3,(Token *)local_5d8);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
            if (!bVar1) {
              testing::Message::Message(&local_608);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_600);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         &lexer_5.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                         kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,0x2fa,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)
                         &lexer_5.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,&local_608
                        );
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         &lexer_5.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
              testing::Message::~Message(&local_608);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
            wasm::WATParser::Token::~Token((Token *)local_5d8);
            expected.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._44_4_ = 0;
          }
          wasm::WATParser::Lexer::~Lexer((Lexer *)local_540);
          if (expected.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._44_4_ == 0) {
            join_0x00000010_0x00000000_ = sv("42E1",4);
            wasm::WATParser::Lexer::Lexer((Lexer *)local_670,join_0x00000010_0x00000000_);
            bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_670);
            local_691 = (bool)(~bVar1 & 1);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_690,&local_691,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
            if (!bVar1) {
              testing::Message::Message(&local_6a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)
                         ((long)&expected_5.data.
                                 super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         + 0x28),(internal *)local_690,(AssertionResult *)"lexer.empty()","true",
                         "false",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_6a8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,0x2fe,pcVar2);
              testing::internal::AssertHelper::operator=(&local_6a8,&local_6a0);
              testing::internal::AssertHelper::~AssertHelper(&local_6a8);
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&expected_5.data.
                                 super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         + 0x28));
              testing::Message::~Message(&local_6a0);
            }
            expected.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._45_3_ = 0;
            expected.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._44_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
            if (expected.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._44_4_ == 0) {
              _local_708 = sv("42E1",4);
              std::optional<unsigned_long>::optional
                        ((optional<unsigned_long> *)&gtest_ar_5.message_);
              std::
              variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
              ::variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                        ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                          *)&expected_5.span._M_str,(FloatTok *)&gtest_ar_5.message_);
              pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_670);
              testing::internal::EqHelper::
              Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                        ((EqHelper *)local_730,"*lexer","expected",pTVar3,(Token *)local_708);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
              if (!bVar1) {
                testing::Message::Message(&local_738);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_730);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)
                           &lexer_6.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                           kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                           ,0x300,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)
                           &lexer_6.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                           &local_738);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)
                           &lexer_6.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
                testing::Message::~Message(&local_738);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
              wasm::WATParser::Token::~Token((Token *)local_708);
              expected.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._44_4_ = 0;
            }
            wasm::WATParser::Lexer::~Lexer((Lexer *)local_670);
            if (expected.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._44_4_ == 0) {
              join_0x00000010_0x00000000_ = sv("42e+2",5);
              wasm::WATParser::Lexer::Lexer((Lexer *)local_7a0,join_0x00000010_0x00000000_);
              bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_7a0);
              local_7c1 = (bool)(~bVar1 & 1);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_7c0,&local_7c1,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
              if (!bVar1) {
                testing::Message::Message(&local_7d0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)
                           ((long)&expected_6.data.
                                   super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           + 0x28),(internal *)local_7c0,(AssertionResult *)"lexer.empty()","true",
                           "false",in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_7d8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                           ,0x304,pcVar2);
                testing::internal::AssertHelper::operator=(&local_7d8,&local_7d0);
                testing::internal::AssertHelper::~AssertHelper(&local_7d8);
                std::__cxx11::string::~string
                          ((string *)
                           ((long)&expected_6.data.
                                   super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           + 0x28));
                testing::Message::~Message(&local_7d0);
              }
              expected.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._45_3_ = 0;
              expected.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._44_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
              if (expected.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._44_4_ == 0) {
                _local_838 = sv("42e+2",5);
                std::optional<unsigned_long>::optional
                          ((optional<unsigned_long> *)&gtest_ar_6.message_);
                std::
                variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                ::variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                          ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                            *)&expected_6.span._M_str,(FloatTok *)&gtest_ar_6.message_);
                pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_7a0);
                testing::internal::EqHelper::
                Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                          ((EqHelper *)local_860,"*lexer","expected",pTVar3,(Token *)local_838);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_860);
                if (!bVar1) {
                  testing::Message::Message(&local_868);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_860);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)
                             &lexer_7.curr.
                              super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                             kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x306,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)
                             &lexer_7.curr.
                              super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                             &local_868);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)
                             &lexer_7.curr.
                              super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
                  testing::Message::~Message(&local_868);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_860);
                wasm::WATParser::Token::~Token((Token *)local_838);
                expected.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._44_4_ = 0;
              }
              wasm::WATParser::Lexer::~Lexer((Lexer *)local_7a0);
              if (expected.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._44_4_ == 0) {
                join_0x00000010_0x00000000_ = sv("42.E-02",7);
                wasm::WATParser::Lexer::Lexer((Lexer *)local_8d0,join_0x00000010_0x00000000_);
                bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_8d0);
                local_8f1 = (bool)(~bVar1 & 1);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_8f0,&local_8f1,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_8f0);
                if (!bVar1) {
                  testing::Message::Message(&local_900);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)
                             ((long)&expected_7.data.
                                     super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             + 0x28),(internal *)local_8f0,(AssertionResult *)"lexer.empty()","true"
                             ,"false",in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_908,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x30a,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_908,&local_900);
                  testing::internal::AssertHelper::~AssertHelper(&local_908);
                  std::__cxx11::string::~string
                            ((string *)
                             ((long)&expected_7.data.
                                     super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             + 0x28));
                  testing::Message::~Message(&local_900);
                }
                expected.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._45_3_ = 0;
                expected.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._44_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
                if (expected.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._44_4_ == 0) {
                  _local_968 = sv("42.E-02",7);
                  std::optional<unsigned_long>::optional
                            ((optional<unsigned_long> *)&gtest_ar_7.message_);
                  std::
                  variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                  ::variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                            ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                              *)&expected_7.span._M_str,(FloatTok *)&gtest_ar_7.message_);
                  pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_8d0);
                  testing::internal::EqHelper::
                  Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                            ((EqHelper *)local_990,"*lexer","expected",pTVar3,(Token *)local_968);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_990);
                  if (!bVar1) {
                    testing::Message::Message(&local_998);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_990)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)
                               &lexer_8.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                               kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                               ,0x30c,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)
                               &lexer_8.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                               &local_998);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)
                               &lexer_8.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
                    testing::Message::~Message(&local_998);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
                  wasm::WATParser::Token::~Token((Token *)local_968);
                  expected.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._44_4_ = 0;
                }
                wasm::WATParser::Lexer::~Lexer((Lexer *)local_8d0);
                if (expected.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._44_4_ == 0) {
                  join_0x00000010_0x00000000_ = sv("42.0e0",6);
                  wasm::WATParser::Lexer::Lexer((Lexer *)local_a00,join_0x00000010_0x00000000_);
                  bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_a00);
                  local_a21 = (bool)(~bVar1 & 1);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_a20,&local_a21,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_a20);
                  if (!bVar1) {
                    testing::Message::Message(&local_a30);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)
                               ((long)&expected_8.data.
                                       super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               + 0x28),(internal *)local_a20,(AssertionResult *)"lexer.empty()",
                               "true","false",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_a38,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                               ,0x310,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_a38,&local_a30);
                    testing::internal::AssertHelper::~AssertHelper(&local_a38);
                    std::__cxx11::string::~string
                              ((string *)
                               ((long)&expected_8.data.
                                       super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               + 0x28));
                    testing::Message::~Message(&local_a30);
                  }
                  expected.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._45_3_ = 0;
                  expected.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._44_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a20);
                  if (expected.data.
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._44_4_ == 0) {
                    _local_a98 = sv("42.0e0",6);
                    std::optional<unsigned_long>::optional
                              ((optional<unsigned_long> *)&gtest_ar_8.message_);
                    std::
                    variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                    ::variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                              ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                *)&expected_8.span._M_str,(FloatTok *)&gtest_ar_8.message_);
                    pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_a00);
                    testing::internal::EqHelper::
                    Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                              ((EqHelper *)local_ac0,"*lexer","expected",pTVar3,(Token *)local_a98);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_ac0);
                    if (!bVar1) {
                      testing::Message::Message(&local_ac8);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_ac0);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)
                                 &lexer_9.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                                 kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                 ,0x312,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)
                                 &lexer_9.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                                 &local_ac8);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)
                                 &lexer_9.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
                      testing::Message::~Message(&local_ac8);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac0);
                    wasm::WATParser::Token::~Token((Token *)local_a98);
                    expected.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._44_4_ = 0;
                  }
                  wasm::WATParser::Lexer::~Lexer((Lexer *)local_a00);
                  if (expected.data.
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._44_4_ == 0) {
                    join_0x00000010_0x00000000_ = sv("42.0E1",6);
                    wasm::WATParser::Lexer::Lexer((Lexer *)local_b30,join_0x00000010_0x00000000_);
                    bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_b30);
                    local_b51 = (bool)(~bVar1 & 1);
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_b50,&local_b51,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_b50);
                    if (!bVar1) {
                      testing::Message::Message(&local_b60);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)
                                 ((long)&expected_9.data.
                                         super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 + 0x28),(internal *)local_b50,(AssertionResult *)"lexer.empty()",
                                 "true","false",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_b68,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                 ,0x316,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_b68,&local_b60);
                      testing::internal::AssertHelper::~AssertHelper(&local_b68);
                      std::__cxx11::string::~string
                                ((string *)
                                 ((long)&expected_9.data.
                                         super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 + 0x28));
                      testing::Message::~Message(&local_b60);
                    }
                    expected.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._45_3_ = 0;
                    expected.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._44_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b50);
                    if (expected.data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._44_4_ == 0) {
                      _local_bc8 = sv("42.0E1",6);
                      std::optional<unsigned_long>::optional
                                ((optional<unsigned_long> *)&gtest_ar_9.message_);
                      std::
                      variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                      ::variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                                ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                  *)&expected_9.span._M_str,(FloatTok *)&gtest_ar_9.message_);
                      pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_b30);
                      testing::internal::EqHelper::
                      Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                                ((EqHelper *)local_bf0,"*lexer","expected",pTVar3,(Token *)local_bc8
                                );
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_bf0);
                      if (!bVar1) {
                        testing::Message::Message(&local_bf8);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_bf0);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)
                                   &lexer_10.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged
                                   ,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                   ,0x318,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)
                                   &lexer_10.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged
                                   ,&local_bf8);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)
                                   &lexer_10.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged
                                  );
                        testing::Message::~Message(&local_bf8);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf0);
                      wasm::WATParser::Token::~Token((Token *)local_bc8);
                      expected.data.
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._44_4_ = 0;
                    }
                    wasm::WATParser::Lexer::~Lexer((Lexer *)local_b30);
                    if (expected.data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._44_4_ == 0) {
                      join_0x00000010_0x00000000_ = sv("42.0e+2",7);
                      wasm::WATParser::Lexer::Lexer((Lexer *)local_c60,join_0x00000010_0x00000000_);
                      bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_c60);
                      local_c81 = (bool)(~bVar1 & 1);
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_c80,&local_c81,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_c80);
                      if (!bVar1) {
                        testing::Message::Message(&local_c90);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)
                                   ((long)&expected_10.data.
                                           super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   + 0x28),(internal *)local_c80,(AssertionResult *)"lexer.empty()",
                                   "true","false",in_R9);
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_c98,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                   ,0x31c,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_c98,&local_c90);
                        testing::internal::AssertHelper::~AssertHelper(&local_c98);
                        std::__cxx11::string::~string
                                  ((string *)
                                   ((long)&expected_10.data.
                                           super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   + 0x28));
                        testing::Message::~Message(&local_c90);
                      }
                      expected.data.
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._45_3_ = 0;
                      expected.data.
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._44_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c80);
                      if (expected.data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._44_4_ == 0) {
                        _local_cf8 = sv("42.0e+2",7);
                        std::optional<unsigned_long>::optional
                                  ((optional<unsigned_long> *)&gtest_ar_10.message_);
                        std::
                        variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                        ::
                        variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                                  ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                    *)&expected_10.span._M_str,(FloatTok *)&gtest_ar_10.message_);
                        pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_c60);
                        testing::internal::EqHelper::
                        Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                                  ((EqHelper *)local_d20,"*lexer","expected",pTVar3,
                                   (Token *)local_cf8);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_d20);
                        if (!bVar1) {
                          testing::Message::Message(&local_d28);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_d20);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)
                                     &lexer_11.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>.
                                      _M_engaged,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                     ,0x31e,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)
                                     &lexer_11.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>.
                                      _M_engaged,&local_d28);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)
                                     &lexer_11.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>.
                                      _M_engaged);
                          testing::Message::~Message(&local_d28);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_d20);
                        wasm::WATParser::Token::~Token((Token *)local_cf8);
                        expected.data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._44_4_ = 0;
                      }
                      wasm::WATParser::Lexer::~Lexer((Lexer *)local_c60);
                      if (expected.data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._44_4_ == 0) {
                        join_0x00000010_0x00000000_ = sv("42.0E-2",7);
                        wasm::WATParser::Lexer::Lexer
                                  ((Lexer *)local_d90,join_0x00000010_0x00000000_);
                        bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_d90);
                        local_db1 = (bool)(~bVar1 & 1);
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_db0,&local_db1,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_db0);
                        if (!bVar1) {
                          testing::Message::Message(&local_dc0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)
                                     ((long)&expected_11.data.
                                             super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     + 0x28),(internal *)local_db0,
                                     (AssertionResult *)"lexer.empty()","true","false",in_R9);
                          pcVar2 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_dc8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                     ,0x322,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_dc8,&local_dc0);
                          testing::internal::AssertHelper::~AssertHelper(&local_dc8);
                          std::__cxx11::string::~string
                                    ((string *)
                                     ((long)&expected_11.data.
                                             super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     + 0x28));
                          testing::Message::~Message(&local_dc0);
                        }
                        expected.data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._45_3_ = 0;
                        expected.data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._44_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_db0);
                        if (expected.data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._44_4_ == 0) {
                          _local_e28 = sv("42.0E-2",7);
                          std::optional<unsigned_long>::optional
                                    ((optional<unsigned_long> *)&gtest_ar_11.message_);
                          std::
                          variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                          ::
                          variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                                    ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                      *)&expected_11.span._M_str,(FloatTok *)&gtest_ar_11.message_);
                          pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_d90);
                          testing::internal::EqHelper::
                          Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                                    ((EqHelper *)local_e50,"*lexer","expected",pTVar3,
                                     (Token *)local_e28);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_e50);
                          if (!bVar1) {
                            testing::Message::Message(&local_e58);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_e50);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)
                                       &lexer_12.curr.
                                        super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                        .super__Optional_payload_base<wasm::WATParser::Token>.
                                        _M_engaged,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x324,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)
                                       &lexer_12.curr.
                                        super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                        .super__Optional_payload_base<wasm::WATParser::Token>.
                                        _M_engaged,&local_e58);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)
                                       &lexer_12.curr.
                                        super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                        .super__Optional_payload_base<wasm::WATParser::Token>.
                                        _M_engaged);
                            testing::Message::~Message(&local_e58);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_e50);
                          wasm::WATParser::Token::~Token((Token *)local_e28);
                          expected.data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._44_4_ = 0;
                        }
                        wasm::WATParser::Lexer::~Lexer((Lexer *)local_d90);
                        if (expected.data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._44_4_ == 0) {
                          join_0x00000010_0x00000000_ = sv("+42.0e+2",8);
                          wasm::WATParser::Lexer::Lexer
                                    ((Lexer *)local_ec0,join_0x00000010_0x00000000_);
                          bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_ec0);
                          local_ee1 = (bool)(~bVar1 & 1);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_ee0,&local_ee1,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_ee0);
                          if (!bVar1) {
                            testing::Message::Message(&local_ef0);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)
                                       ((long)&expected_12.data.
                                               super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       + 0x28),(internal *)local_ee0,
                                       (AssertionResult *)"lexer.empty()","true","false",in_R9);
                            pcVar2 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_ef8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x328,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_ef8,&local_ef0);
                            testing::internal::AssertHelper::~AssertHelper(&local_ef8);
                            std::__cxx11::string::~string
                                      ((string *)
                                       ((long)&expected_12.data.
                                               super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       + 0x28));
                            testing::Message::~Message(&local_ef0);
                          }
                          expected.data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._45_3_ = 0;
                          expected.data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._44_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_ee0);
                          if (expected.data.
                              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ._44_4_ == 0) {
                            _local_f58 = sv("+42.0e+2",8);
                            std::optional<unsigned_long>::optional
                                      ((optional<unsigned_long> *)&gtest_ar_12.message_);
                            std::
                            variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                            ::
                            variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                                      ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                        *)&expected_12.span._M_str,(FloatTok *)&gtest_ar_12.message_
                                      );
                            pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_ec0);
                            testing::internal::EqHelper::
                            Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                                      ((EqHelper *)local_f80,"*lexer","expected",pTVar3,
                                       (Token *)local_f58);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_f80);
                            if (!bVar1) {
                              testing::Message::Message(&local_f88);
                              pcVar2 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_f80);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)
                                         &lexer_13.curr.
                                          super__Optional_base<wasm::WATParser::Token,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                          .super__Optional_payload_base<wasm::WATParser::Token>.
                                          _M_engaged,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x32a,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)
                                         &lexer_13.curr.
                                          super__Optional_base<wasm::WATParser::Token,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                          .super__Optional_payload_base<wasm::WATParser::Token>.
                                          _M_engaged,&local_f88);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)
                                         &lexer_13.curr.
                                          super__Optional_base<wasm::WATParser::Token,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                          .super__Optional_payload_base<wasm::WATParser::Token>.
                                          _M_engaged);
                              testing::Message::~Message(&local_f88);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_f80)
                            ;
                            wasm::WATParser::Token::~Token((Token *)local_f58);
                            expected.data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._44_4_ = 0;
                          }
                          wasm::WATParser::Lexer::~Lexer((Lexer *)local_ec0);
                          if (expected.data.
                              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ._44_4_ == 0) {
                            join_0x00000010_0x00000000_ = sv("-42.0e+2",8);
                            wasm::WATParser::Lexer::Lexer
                                      ((Lexer *)local_ff0,join_0x00000010_0x00000000_);
                            bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_ff0);
                            local_1011 = (bool)(~bVar1 & 1);
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_1010,&local_1011,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_1010);
                            if (!bVar1) {
                              testing::Message::Message(&local_1020);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)
                                         ((long)&expected_13.data.
                                                 super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         + 0x28),(internal *)local_1010,
                                         (AssertionResult *)"lexer.empty()","true","false",in_R9);
                              pcVar2 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_1028,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x32e,pcVar2);
                              testing::internal::AssertHelper::operator=(&local_1028,&local_1020);
                              testing::internal::AssertHelper::~AssertHelper(&local_1028);
                              std::__cxx11::string::~string
                                        ((string *)
                                         ((long)&expected_13.data.
                                                 super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         + 0x28));
                              testing::Message::~Message(&local_1020);
                            }
                            expected.data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._45_3_ = 0;
                            expected.data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._44_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult
                                      ((AssertionResult *)local_1010);
                            if (expected.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._44_4_ == 0) {
                              _local_1088 = sv("-42.0e+2",8);
                              std::optional<unsigned_long>::optional
                                        ((optional<unsigned_long> *)&gtest_ar_13.message_);
                              std::
                              variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                              ::
                              variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                                        ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                          *)&expected_13.span._M_str,
                                         (FloatTok *)&gtest_ar_13.message_);
                              pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_ff0);
                              testing::internal::EqHelper::
                              Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                                        ((EqHelper *)local_10b0,"*lexer","expected",pTVar3,
                                         (Token *)local_1088);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_10b0);
                              if (!bVar1) {
                                testing::Message::Message(&local_10b8);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_10b0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)
                                           &lexer_14.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x330,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)
                                           &lexer_14.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,&local_10b8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)
                                           &lexer_14.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged);
                                testing::Message::~Message(&local_10b8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_10b0);
                              wasm::WATParser::Token::~Token((Token *)local_1088);
                              expected.data.
                              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ._44_4_ = 0;
                            }
                            wasm::WATParser::Lexer::~Lexer((Lexer *)local_ff0);
                            if (expected.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._44_4_ == 0) {
                              join_0x00000010_0x00000000_ = sv("4_2.0_0e+0_2",0xc);
                              wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_1120,join_0x00000010_0x00000000_);
                              bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_1120);
                              local_1141 = (bool)(~bVar1 & 1);
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1140,&local_1141,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1140);
                              if (!bVar1) {
                                testing::Message::Message(&local_1150);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           ((long)&expected_14.data.
                                                                                                      
                                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           + 0x28),(internal *)local_1140,
                                           (AssertionResult *)"lexer.empty()","true","false",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1158,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x334,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1158,&local_1150);
                                testing::internal::AssertHelper::~AssertHelper(&local_1158);
                                std::__cxx11::string::~string
                                          ((string *)
                                           ((long)&expected_14.data.
                                                                                                      
                                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           + 0x28));
                                testing::Message::~Message(&local_1150);
                              }
                              expected.data.
                              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ._45_3_ = 0;
                              expected.data.
                              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ._44_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1140);
                              if (expected.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._44_4_ == 0) {
                                _local_11b8 = sv("4_2.0_0e+0_2",0xc);
                                std::optional<unsigned_long>::optional
                                          ((optional<unsigned_long> *)&gtest_ar_14.message_);
                                std::
                                variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                ::
                                variant<wasm::WATParser::FloatTok,void,void,wasm::WATParser::FloatTok,void>
                                          ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                            *)&expected_14.span._M_str,
                                           (FloatTok *)&gtest_ar_14.message_);
                                pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_1120);
                                testing::internal::EqHelper::
                                Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                                          ((EqHelper *)local_11e0,"*lexer","expected",pTVar3,
                                           (Token *)local_11b8);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_11e0);
                                if (!bVar1) {
                                  testing::Message::Message(&local_11e8);
                                  pcVar2 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_11e0);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)
                                             &lexer_15.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x336,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)
                                             &lexer_15.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,&local_11e8);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)
                                             &lexer_15.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_11e8);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_11e0);
                                wasm::WATParser::Token::~Token((Token *)local_11b8);
                                expected.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._44_4_ = 0;
                              }
                              wasm::WATParser::Lexer::~Lexer((Lexer *)local_1120);
                              if (expected.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._44_4_ == 0) {
                                join_0x00000010_0x00000000_ = sv("+junk",5);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_1250,join_0x00000010_0x00000000_);
                                local_1271 = wasm::WATParser::Lexer::empty((Lexer *)local_1250);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_1270,&local_1271,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1270);
                                if (!bVar1) {
                                  testing::Message::Message(&local_1280);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_16.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_1270,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_1288,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x33a,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_1288,&local_1280);
                                  testing::internal::AssertHelper::~AssertHelper(&local_1288);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_16.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_1280);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1270);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_1250);
                                join_0x00000010_0x00000000_ = sv("42junk",6);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_1308,join_0x00000010_0x00000000_);
                                local_1329 = wasm::WATParser::Lexer::empty((Lexer *)local_1308);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_1328,&local_1329,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1328);
                                if (!bVar1) {
                                  testing::Message::Message(&local_1338);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_17.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_1328,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_1340,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x33e,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_1340,&local_1338);
                                  testing::internal::AssertHelper::~AssertHelper(&local_1340);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_17.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_1338);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1328);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_1308);
                                join_0x00000010_0x00000000_ = sv("42.junk",7);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_13c0,join_0x00000010_0x00000000_);
                                local_13e1 = wasm::WATParser::Lexer::empty((Lexer *)local_13c0);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_13e0,&local_13e1,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_13e0);
                                if (!bVar1) {
                                  testing::Message::Message(&local_13f0);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_18.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_13e0,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_13f8,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x342,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_13f8,&local_13f0);
                                  testing::internal::AssertHelper::~AssertHelper(&local_13f8);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_18.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_13f0);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_13e0);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_13c0);
                                join_0x00000010_0x00000000_ = sv("42.0junk",8);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_1478,join_0x00000010_0x00000000_);
                                local_1499 = wasm::WATParser::Lexer::empty((Lexer *)local_1478);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_1498,&local_1499,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1498);
                                if (!bVar1) {
                                  testing::Message::Message(&local_14a8);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_19.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_1498,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_14b0,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x346,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_14b0,&local_14a8);
                                  testing::internal::AssertHelper::~AssertHelper(&local_14b0);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_19.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_14a8);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1498);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_1478);
                                join_0x00000010_0x00000000_ = sv("42.Ejunk",8);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_1530,join_0x00000010_0x00000000_);
                                local_1551 = wasm::WATParser::Lexer::empty((Lexer *)local_1530);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_1550,&local_1551,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1550);
                                if (!bVar1) {
                                  testing::Message::Message(&local_1560);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_20.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_1550,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_1568,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x34a,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_1568,&local_1560);
                                  testing::internal::AssertHelper::~AssertHelper(&local_1568);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_20.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_1560);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1550);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_1530);
                                join_0x00000010_0x00000000_ = sv("42.e-junk",9);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_15e8,join_0x00000010_0x00000000_);
                                local_1609 = wasm::WATParser::Lexer::empty((Lexer *)local_15e8);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_1608,&local_1609,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1608);
                                if (!bVar1) {
                                  testing::Message::Message(&local_1618);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_21.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_1608,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_1620,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x34e,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_1620,&local_1618);
                                  testing::internal::AssertHelper::~AssertHelper(&local_1620);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_21.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_1618);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1608);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_15e8);
                                join_0x00000010_0x00000000_ = sv("42.e-10junk",0xb);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_16a0,join_0x00000010_0x00000000_);
                                local_16c1 = wasm::WATParser::Lexer::empty((Lexer *)local_16a0);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_16c0,&local_16c1,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_16c0);
                                if (!bVar1) {
                                  testing::Message::Message(&local_16d0);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_22.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_16c0,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_16d8,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x352,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_16d8,&local_16d0);
                                  testing::internal::AssertHelper::~AssertHelper(&local_16d8);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_22.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_16d0);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_16c0);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_16a0);
                                join_0x00000010_0x00000000_ = sv("+",1);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_1758,join_0x00000010_0x00000000_);
                                local_1779 = wasm::WATParser::Lexer::empty((Lexer *)local_1758);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_1778,&local_1779,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1778);
                                if (!bVar1) {
                                  testing::Message::Message(&local_1788);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_23.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_1778,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_1790,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x356,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_1790,&local_1788);
                                  testing::internal::AssertHelper::~AssertHelper(&local_1790);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_23.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_1788);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1778);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_1758);
                                join_0x00000010_0x00000000_ = sv("42e",3);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_1810,join_0x00000010_0x00000000_);
                                local_1831 = wasm::WATParser::Lexer::empty((Lexer *)local_1810);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_1830,&local_1831,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1830);
                                if (!bVar1) {
                                  testing::Message::Message(&local_1840);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_24.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_1830,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_1848,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x35a,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_1848,&local_1840);
                                  testing::internal::AssertHelper::~AssertHelper(&local_1848);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_24.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_1840);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1830);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_1810);
                                join_0x00000010_0x00000000_ = sv("42eABC",6);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_18c8,join_0x00000010_0x00000000_);
                                local_18e9 = wasm::WATParser::Lexer::empty((Lexer *)local_18c8);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_18e8,&local_18e9,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_18e8);
                                if (!bVar1) {
                                  testing::Message::Message(&local_18f8);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_25.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_18e8,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_1900,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x35e,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_1900,&local_18f8);
                                  testing::internal::AssertHelper::~AssertHelper(&local_1900);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_25.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_18f8);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_18e8);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_18c8);
                                join_0x00000010_0x00000000_ = sv("42e0xABC",8);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_1980,join_0x00000010_0x00000000_);
                                local_19a1 = wasm::WATParser::Lexer::empty((Lexer *)local_1980);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_19a0,&local_19a1,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_19a0);
                                if (!bVar1) {
                                  testing::Message::Message(&local_19b0);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_26.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_19a0,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_19b8,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x362,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_19b8,&local_19b0);
                                  testing::internal::AssertHelper::~AssertHelper(&local_19b8);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_26.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_19b0);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_19a0);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_1980);
                                join_0x00000010_0x00000000_ = sv("+-42",4);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_1a38,join_0x00000010_0x00000000_);
                                local_1a59 = wasm::WATParser::Lexer::empty((Lexer *)local_1a38);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_1a58,&local_1a59,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1a58);
                                if (!bVar1) {
                                  testing::Message::Message(&local_1a68);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_27.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_1a58,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_1a70,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x366,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_1a70,&local_1a68);
                                  testing::internal::AssertHelper::~AssertHelper(&local_1a70);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_27.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_1a68);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1a58);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_1a38);
                                join_0x00000010_0x00000000_ = sv("-+42",4);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_1af0,join_0x00000010_0x00000000_);
                                local_1b11 = wasm::WATParser::Lexer::empty((Lexer *)local_1af0);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_1b10,&local_1b11,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1b10);
                                if (!bVar1) {
                                  testing::Message::Message(&local_1b20);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_28.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_1b10,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_1b28,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x36a,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_1b28,&local_1b20);
                                  testing::internal::AssertHelper::~AssertHelper(&local_1b28);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_28.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_1b20);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1b10);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_1af0);
                                join_0x00000010_0x00000000_ = sv("42e+-0",6);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_1ba8,join_0x00000010_0x00000000_);
                                local_1bc9 = wasm::WATParser::Lexer::empty((Lexer *)local_1ba8);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_1bc8,&local_1bc9,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1bc8);
                                if (!bVar1) {
                                  testing::Message::Message(&local_1bd8);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_29.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_1bc8,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_1be0,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x36e,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_1be0,&local_1bd8);
                                  testing::internal::AssertHelper::~AssertHelper(&local_1be0);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_29.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_1bd8);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1bc8);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_1ba8);
                                join_0x00000010_0x00000000_ = sv("42e-+0",6);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_1c60,join_0x00000010_0x00000000_);
                                local_1c81 = wasm::WATParser::Lexer::empty((Lexer *)local_1c60);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_1c80,&local_1c81,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1c80);
                                if (!bVar1) {
                                  testing::Message::Message(&local_1c90);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_30.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_1c80,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_1c98,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x372,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_1c98,&local_1c90);
                                  testing::internal::AssertHelper::~AssertHelper(&local_1c98);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_30.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_1c90);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1c80);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_1c60);
                                join_0x00000010_0x00000000_ = sv("42p0",4);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_1d18,join_0x00000010_0x00000000_);
                                local_1d39 = wasm::WATParser::Lexer::empty((Lexer *)local_1d18);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_1d38,&local_1d39,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1d38);
                                if (!bVar1) {
                                  testing::Message::Message(&local_1d48);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer_31.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,(internal *)local_1d38,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_1d50,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x376,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_1d50,&local_1d48);
                                  testing::internal::AssertHelper::~AssertHelper(&local_1d50);
                                  std::__cxx11::string::~string
                                            ((string *)
                                             &lexer_31.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged);
                                  testing::Message::~Message(&local_1d48);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1d38);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_1d18);
                                join_0x00000010_0x00000000_ = sv("42P0",4);
                                wasm::WATParser::Lexer::Lexer
                                          ((Lexer *)local_1dd0,join_0x00000010_0x00000000_);
                                local_1df1 = wasm::WATParser::Lexer::empty((Lexer *)local_1dd0);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_1df0,&local_1df1,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1df0);
                                if (!bVar1) {
                                  testing::Message::Message(&local_1e00);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            (&local_1e28,(internal *)local_1df0,
                                             (AssertionResult *)"lexer.empty()","false","true",in_R9
                                            );
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_1e08,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x37a,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            (&local_1e08,&local_1e00);
                                  testing::internal::AssertHelper::~AssertHelper(&local_1e08);
                                  std::__cxx11::string::~string((string *)&local_1e28);
                                  testing::Message::~Message(&local_1e00);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1df0);
                                wasm::WATParser::Lexer::~Lexer((Lexer *)local_1dd0);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(LexerTest, LexFloat) {
  {
    Lexer lexer("42"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42"sv, IntTok{42, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42."sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42."sv, FloatTok{{}, 42.}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.5"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.5"sv, FloatTok{{}, 42.5}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42e0"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42e0"sv, FloatTok{{}, 42e0}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.e1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.e1"sv, FloatTok{{}, 42.e1}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42E1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42E1"sv, FloatTok{{}, 42E1}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42e+2"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42e+2"sv, FloatTok{{}, 42e+2}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.E-02"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.E-02"sv, FloatTok{{}, 42.E-02}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.0e0"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.0e0"sv, FloatTok{{}, 42.0e0}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.0E1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.0E1"sv, FloatTok{{}, 42.0E1}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.0e+2"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.0e+2"sv, FloatTok{{}, 42.0e+2}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.0E-2"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.0E-2"sv, FloatTok{{}, 42.0E-2}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+42.0e+2"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"+42.0e+2"sv, FloatTok{{}, +42.0e+2}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("-42.0e+2"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"-42.0e+2"sv, FloatTok{{}, -42.0e+2}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("4_2.0_0e+0_2"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"4_2.0_0e+0_2"sv, FloatTok{{}, 42.00e+02}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+junk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42junk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42.junk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42.0junk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42.Ejunk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42.e-junk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42.e-10junk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("+"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42e"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42eABC"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42e0xABC"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("+-42"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("-+42"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42e+-0"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42e-+0"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42p0"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42P0"sv);
    EXPECT_TRUE(lexer.empty());
  }
}